

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writeRgba2.cpp
# Opt level: O0

void writeRgba2(char *fileName,Rgba *pixels,int width,int height,Box2i *dataWindow)

{
  undefined4 uVar1;
  int in_ECX;
  int in_EDX;
  ulong in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  RgbaOutputFile file;
  Box2i displayWindow;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffff50;
  Vec2<float> local_60;
  Rgba local_58 [3];
  Vec2<int> local_40;
  Vec2<int> local_38;
  undefined1 local_30 [16];
  undefined8 local_20;
  int local_18;
  int local_14;
  ulong local_10;
  undefined8 local_8;
  
  local_20 = in_R8;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Imath_3_2::Vec2<int>::Vec2(&local_38,0,0);
  Imath_3_2::Vec2<int>::Vec2(&local_40,local_14 + -1,local_18 + -1);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            (in_stack_ffffffffffffff50,
             (Vec2<int> *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             (Vec2<int> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  Imath_3_2::Vec2<float>::Vec2(&local_60,0.0,0.0);
  uVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)0x3f800000,local_58,local_8,local_30,local_20,0xf,&local_60,0,4,uVar1
            );
  Imf_3_4::RgbaOutputFile::setFrameBuffer(local_58,local_10,1);
  Imf_3_4::RgbaOutputFile::writePixels((int)local_58);
  Imf_3_4::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)local_58);
  return;
}

Assistant:

void
writeRgba2 (
    const char   fileName[],
    const Rgba*  pixels,
    int          width,
    int          height,
    const Box2i& dataWindow)
{
    Box2i          displayWindow (V2i (0, 0), V2i (width - 1, height - 1));
    RgbaOutputFile file (fileName, displayWindow, dataWindow, WRITE_RGBA);
    file.setFrameBuffer (pixels, 1, width);
    file.writePixels (dataWindow.max.y - dataWindow.min.y + 1);
}